

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osdtext.cpp
# Opt level: O0

void __thiscall CMU462::OSDText::set_text(OSDText *this,int line_id,string *text)

{
  bool bVar1;
  pointer pOVar2;
  string *in_RDX;
  int in_ESI;
  __normal_iterator<CMU462::OSDLine_*,_std::vector<CMU462::OSDLine,_std::allocator<CMU462::OSDLine>_>_>
  *in_RDI;
  iterator it;
  __normal_iterator<CMU462::OSDLine_*,_std::vector<CMU462::OSDLine,_std::allocator<CMU462::OSDLine>_>_>
  local_20 [2];
  int local_c;
  
  local_c = in_ESI;
  local_20[0]._M_current =
       (OSDLine *)
       std::vector<CMU462::OSDLine,_std::allocator<CMU462::OSDLine>_>::begin
                 ((vector<CMU462::OSDLine,_std::allocator<CMU462::OSDLine>_> *)in_RDX);
  while( true ) {
    std::vector<CMU462::OSDLine,_std::allocator<CMU462::OSDLine>_>::end
              ((vector<CMU462::OSDLine,_std::allocator<CMU462::OSDLine>_> *)in_RDX);
    bVar1 = __gnu_cxx::operator!=
                      (in_RDI,(__normal_iterator<CMU462::OSDLine_*,_std::vector<CMU462::OSDLine,_std::allocator<CMU462::OSDLine>_>_>
                               *)in_RDX);
    if (!bVar1) {
      return;
    }
    pOVar2 = __gnu_cxx::
             __normal_iterator<CMU462::OSDLine_*,_std::vector<CMU462::OSDLine,_std::allocator<CMU462::OSDLine>_>_>
             ::operator->(local_20);
    if (pOVar2->id == local_c) break;
    __gnu_cxx::
    __normal_iterator<CMU462::OSDLine_*,_std::vector<CMU462::OSDLine,_std::allocator<CMU462::OSDLine>_>_>
    ::operator++(local_20);
  }
  pOVar2 = __gnu_cxx::
           __normal_iterator<CMU462::OSDLine_*,_std::vector<CMU462::OSDLine,_std::allocator<CMU462::OSDLine>_>_>
           ::operator->(local_20);
  std::__cxx11::string::operator=((string *)&pOVar2->text,in_RDX);
  return;
}

Assistant:

void OSDText::set_text(int line_id, string text) {
  vector<OSDLine>::iterator it = lines.begin();
  while(it != lines.end()) {
    if(it->id == line_id) {
      it->text = text;
      break;
    }
    ++it;
  }
}